

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O1

int yaml_emitter_write_indent(yaml_emitter_t *emitter)

{
  yaml_break_t yVar1;
  yaml_char_t *pyVar2;
  yaml_char_t yVar3;
  int iVar4;
  int iVar5;
  
  iVar5 = 0;
  if (0 < emitter->indent) {
    iVar5 = emitter->indent;
  }
  if (((emitter->indention != 0) && (emitter->column <= iVar5)) &&
     ((emitter->column != iVar5 || (emitter->whitespace != 0)))) goto LAB_001073fa;
  if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
     (iVar4 = yaml_emitter_flush(emitter), iVar4 == 0)) {
    return 0;
  }
  yVar1 = emitter->line_break;
  if (yVar1 == YAML_CR_BREAK) {
    yVar3 = '\r';
LAB_001073dc:
    pyVar2 = (emitter->buffer).pointer;
    (emitter->buffer).pointer = pyVar2 + 1;
    *pyVar2 = yVar3;
  }
  else {
    if (yVar1 == YAML_CRLN_BREAK) {
      pyVar2 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pyVar2 + 1;
      *pyVar2 = '\r';
LAB_001073d6:
      yVar3 = '\n';
      goto LAB_001073dc;
    }
    if (yVar1 == YAML_LN_BREAK) goto LAB_001073d6;
  }
  emitter->column = 0;
  emitter->line = emitter->line + 1;
LAB_001073fa:
  iVar4 = emitter->column;
  while( true ) {
    if (iVar5 <= iVar4) {
      emitter->whitespace = 1;
      emitter->indention = 1;
      return 1;
    }
    if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
       (iVar4 = yaml_emitter_flush(emitter), iVar4 == 0)) break;
    pyVar2 = (emitter->buffer).pointer;
    (emitter->buffer).pointer = pyVar2 + 1;
    *pyVar2 = ' ';
    iVar4 = emitter->column + 1;
    emitter->column = iVar4;
  }
  return 0;
}

Assistant:

static int
yaml_emitter_write_indent(yaml_emitter_t *emitter)
{
    int indent = (emitter->indent >= 0) ? emitter->indent : 0;

    if (!emitter->indention || emitter->column > indent
            || (emitter->column == indent && !emitter->whitespace)) {
        if (!PUT_BREAK(emitter)) return 0;
    }

    while (emitter->column < indent) {
        if (!PUT(emitter, ' ')) return 0;
    }

    emitter->whitespace = 1;
    emitter->indention = 1;

    return 1;
}